

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

void spki_table_swap(spki_table *a,spki_table *b)

{
  tommy_list ptVar1;
  long in_FS_OFFSET;
  tommy_hashlin tmp_hashtable;
  undefined1 auStack_158 [288];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&a->lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&b->lock);
  memcpy(auStack_158,a,0x120);
  ptVar1 = a->list;
  memcpy(a,b,0x120);
  a->list = b->list;
  memcpy(b,auStack_158,0x120);
  b->list = ptVar1;
  pthread_rwlock_unlock((pthread_rwlock_t *)&a->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&b->lock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_swap(struct spki_table *a, struct spki_table *b)
{
	tommy_hashlin tmp_hashtable;
	tommy_list tmp_list;

	pthread_rwlock_wrlock(&a->lock);
	pthread_rwlock_wrlock(&b->lock);

	memcpy(&tmp_hashtable, &a->hashtable, sizeof(tmp_hashtable));
	memcpy(&tmp_list, &a->list, sizeof(tmp_list));

	memcpy(&a->hashtable, &b->hashtable, sizeof(tmp_hashtable));
	memcpy(&a->list, &b->list, sizeof(tmp_list));

	memcpy(&b->hashtable, &tmp_hashtable, sizeof(tmp_hashtable));
	memcpy(&b->list, &tmp_list, sizeof(tmp_list));

	pthread_rwlock_unlock(&a->lock);
	pthread_rwlock_unlock(&b->lock);
}